

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.h
# Opt level: O0

void * utf8ncpy(void *dst,void *src,size_t n)

{
  char *pcVar1;
  bool bVar2;
  char *s;
  char *d;
  size_t n_local;
  void *src_local;
  void *dst_local;
  
  s = (char *)src;
  d = (char *)dst;
  n_local = n;
  do {
    pcVar1 = d + 1;
    *d = *s;
    bVar2 = false;
    if (s[1] != '\0') {
      n_local = n_local - 1;
      bVar2 = n_local != 0;
    }
    s = s + 1;
    d = pcVar1;
  } while (bVar2);
  for (; n_local != 0; n_local = n_local - 1) {
    *d = '\0';
    d = d + 1;
  }
  return dst;
}

Assistant:

void *utf8ncpy(void *dst, const void *src, size_t n) {
  char *d = (char *)dst;
  const char *s = (const char *)src;

  // overwriting anything previously in dst, write byte-by-byte
  // from src
  do {
    *d++ = *s++;
  } while (('\0' != *s) && (0 != --n));

  // append null terminating byte
  while (0 != n) {
    *d++ = '\0';
    n--;
  }

  return dst;
}